

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption(google::protobuf::Message*,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,bool)::__3,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  AlphaNum *in_R9;
  AlphaNum local_e0;
  AlphaNum local_b0;
  AlphaNum local_80;
  string_view local_50 [3];
  
  local_50[0] = NullSafeStringView("Option \"");
  local_80.piece_._M_str = (char *)**(undefined8 **)this;
  local_80.piece_._M_len = (*(undefined8 **)this)[1];
  local_b0.piece_ = NullSafeStringView("\" unknown. Ensure that your proto");
  local_e0.piece_ =
       NullSafeStringView(" definition file imports the proto which defines the option.");
  StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)local_50,&local_80,&local_b0,&local_e0,
                    in_R9);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}